

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfMapNamedBuffer(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  uint *puVar8;
  void *pvVar9;
  undefined4 *puVar10;
  GLuint not_a_buffer_name;
  GLuint GVar11;
  GLuint buffer;
  GLubyte dummy_data [4];
  GLenum invalid_access_flags;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  buffer = 0;
  dummy_data[0] = '\0';
  dummy_data[1] = '\0';
  dummy_data[2] = '\0';
  dummy_data[3] = '\0';
  (**(code **)(lVar7 + 0x3b8))(1);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xf9d);
  (*this->m_pNamedBufferStorage)(buffer,4,dummy_data,0x41);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,4000);
  GVar11 = 0;
  do {
    GVar11 = GVar11 + 1;
    cVar1 = (**(code **)(lVar7 + 0xc68))(GVar11);
  } while (cVar1 != '\0');
  (*this->m_pMapNamedBuffer)(GVar11,35000);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBuffer",0x502,
                           " if buffer is not the name of an existing buffer object.");
  invalid_access_flags = 0;
  do {
    invalid_access_flags = invalid_access_flags + 1;
    puVar8 = std::
             __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                       (TestErrorsOfMapNamedBuffer::valid_access_flags,0x1710e3c,
                        &invalid_access_flags);
  } while (puVar8 != TestErrorsOfMapNamedBuffer::valid_access_flags + 3);
  pvVar9 = (*this->m_pMapNamedBuffer)(buffer,invalid_access_flags);
  bVar3 = ErrorCheckAndLog(this,"glMapNamedBuffer",0x500,
                           " if access is not READ_ONLY, WRITE_ONLY, or READ_WRITE.");
  if (pvVar9 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(buffer);
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
  }
  (*this->m_pMapNamedBuffer)(buffer,35000);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glMapNamedBuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xfd1);
  pvVar9 = (*this->m_pMapNamedBuffer)(buffer,35000);
  bVar4 = ErrorCheckAndLog(this,"glMapNamedBuffer",0x502,
                           " if the buffer object is in a mapped state.");
  (*this->m_pUnmapNamedBuffer)(buffer);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xfd9);
  if (pvVar9 != (void *)0x0) {
    _invalid_access_flags = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "glMapNamedBuffer called on mapped buffer returned non-NULL pointer when error shall occure.This may lead to undefined behavior during next tests (object still may be mapped). Test was terminated prematurely."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&invalid_access_flags,(EndMessageToken *)&tcu::TestLog::EndMessage)
    ;
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  if (buffer != 0) {
    (**(code **)(lVar7 + 0x438))(1,&buffer);
  }
  return (bVar2 && bVar3) && bVar4;
}

Assistant:

bool ErrorsTest::TestErrorsOfMapNamedBuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer		   = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data, GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pMapNamedBuffer(not_a_buffer_name, GL_READ_ONLY);

			is_ok &= ErrorCheckAndLog("glMapNamedBuffer", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test access flag error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			static const glw::GLenum valid_access_flags[] = { GL_READ_ONLY, GL_WRITE_ONLY, GL_READ_WRITE, GL_NONE };
			static const glw::GLenum valid_access_flags_last =
				sizeof(valid_access_flags) / sizeof(valid_access_flags[0]) - 1;

			glw::GLenum invalid_access_flags = 0;

			while (&valid_access_flags[valid_access_flags_last] !=
				   std::find(&valid_access_flags[0], &valid_access_flags[valid_access_flags_last],
							 (++invalid_access_flags)))
				;

			/* Test. */
			glw::GLbyte* mapped_data = (glw::GLbyte*)m_pMapNamedBuffer(buffer, invalid_access_flags);

			is_ok &= ErrorCheckAndLog("glMapNamedBuffer", GL_INVALID_ENUM,
									  " if access is not READ_ONLY, WRITE_ONLY, or READ_WRITE.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test mapping of mapped buffer error behavior. */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer.");

			glw::GLbyte* subsequent_mapped_data = (glw::GLbyte*)m_pMapNamedBuffer(buffer, GL_READ_ONLY);

			is_ok &= ErrorCheckAndLog("glMapNamedBuffer", GL_INVALID_OPERATION,
									  " if the buffer object is in a mapped state.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			if (subsequent_mapped_data)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glMapNamedBuffer called on mapped buffer returned non-NULL pointer when error shall occure."
					   "This may lead to undefined behavior during next tests (object still may be mapped). "
					   "Test was terminated prematurely."
					<< tcu::TestLog::EndMessage;
				throw 0;
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}